

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_c.hpp
# Opt level: O2

void __thiscall CodegenC::FunctionTable::generate_tuple_functions(FunctionTable *this,Type *type)

{
  IndentPrinter *this_00;
  bool bVar1;
  Type *pTVar2;
  Type *pTVar3;
  undefined4 uVar4;
  size_t i;
  ulong uVar5;
  Type void_type;
  Type tuple_type;
  undefined1 local_7c [4];
  Type local_78;
  undefined1 local_6c [4];
  undefined1 local_68 [32];
  char *local_48;
  Type local_40;
  Type local_38;
  
  local_38 = get_type(this,type);
  pTVar2 = TypeInterner::get_void_type();
  local_40 = get_type(this,pTVar2);
  this_00 = this->type_function_printer;
  local_48 = "static % %_copy(%);";
  local_68._0_8_ = &local_38;
  local_68._8_8_ = &local_38;
  local_68._16_8_ = &local_38;
  IndentPrinter::println<Format<CodegenC::Type,CodegenC::Type,CodegenC::Type>>
            (this->function_declaration_printer,
             (Format<CodegenC::Type,_CodegenC::Type,_CodegenC::Type> *)local_68);
  local_48 = "static % %_copy(% tuple) {";
  local_68._0_8_ = &local_38;
  local_68._8_8_ = &local_38;
  local_68._16_8_ = &local_38;
  IndentPrinter::println_increasing<Format<CodegenC::Type,CodegenC::Type,CodegenC::Type>>
            (this_00,(Format<CodegenC::Type,_CodegenC::Type,_CodegenC::Type> *)local_68);
  local_68._16_8_ = "% new_tuple;";
  local_68._0_8_ = &local_38;
  IndentPrinter::println<Format<CodegenC::Type>>(this_00,(Format<CodegenC::Type> *)local_68);
  for (uVar5 = 0; uVar5 < (ulong)((long)type[2]._vptr_Type - (long)type[1]._vptr_Type >> 3);
      uVar5 = uVar5 + 1) {
    bVar1 = is_managed((Type *)type[1]._vptr_Type[uVar5]);
    uVar4 = (undefined4)uVar5;
    if (bVar1) {
      local_7c = (undefined1  [4])uVar4;
      local_78 = get_type(this,(Type *)type[1]._vptr_Type[uVar5]);
      local_68._0_8_ = local_7c;
      local_68._8_8_ = &local_78;
      local_68._16_8_ = local_6c;
      local_48 = "new_tuple.v% = %_copy(tuple.v%);";
      local_6c = (undefined1  [4])uVar4;
      IndentPrinter::println<Format<PrintNumber,CodegenC::Type,PrintNumber>>
                (this_00,(Format<PrintNumber,_CodegenC::Type,_PrintNumber> *)local_68);
    }
    else {
      pTVar2 = (Type *)type[1]._vptr_Type[uVar5];
      pTVar3 = TypeInterner::get_void_type();
      if (pTVar2 != pTVar3) {
        local_78.index._0_4_ = uVar4;
        local_68._0_8_ = &local_78;
        local_68._8_8_ = local_7c;
        local_68._24_8_ = "new_tuple.v% = tuple.v%;";
        local_7c = (undefined1  [4])uVar4;
        IndentPrinter::println<Format<PrintNumber,PrintNumber>>
                  (this_00,(Format<PrintNumber,_PrintNumber> *)local_68);
      }
    }
  }
  IndentPrinter::println<char[18]>(this_00,(char (*) [18])"return new_tuple;");
  IndentPrinter::println_decreasing<char[2]>(this_00,(char (*) [2])0x13589a);
  local_48 = "static % %_free(%);";
  local_68._0_8_ = &local_40;
  local_68._8_8_ = &local_38;
  local_68._16_8_ = &local_38;
  IndentPrinter::println<Format<CodegenC::Type,CodegenC::Type,CodegenC::Type>>
            (this->function_declaration_printer,
             (Format<CodegenC::Type,_CodegenC::Type,_CodegenC::Type> *)local_68);
  local_48 = "static % %_free(% tuple) {";
  local_68._0_8_ = &local_40;
  local_68._8_8_ = &local_38;
  local_68._16_8_ = &local_38;
  IndentPrinter::println_increasing<Format<CodegenC::Type,CodegenC::Type,CodegenC::Type>>
            (this_00,(Format<CodegenC::Type,_CodegenC::Type,_CodegenC::Type> *)local_68);
  for (uVar5 = 0; uVar5 < (ulong)((long)type[2]._vptr_Type - (long)type[1]._vptr_Type >> 3);
      uVar5 = uVar5 + 1) {
    bVar1 = is_managed((Type *)type[1]._vptr_Type[uVar5]);
    if (bVar1) {
      local_78 = get_type(this,(Type *)type[1]._vptr_Type[uVar5]);
      local_7c = SUB84(uVar5,0);
      local_68._0_8_ = &local_78;
      local_68._8_8_ = local_7c;
      local_68._24_8_ = "%_free(tuple.v%);";
      IndentPrinter::println<Format<CodegenC::Type,PrintNumber>>
                (this_00,(Format<CodegenC::Type,_PrintNumber> *)local_68);
    }
  }
  IndentPrinter::println_decreasing<char[2]>(this_00,(char (*) [2])0x13589a);
  return;
}

Assistant:

void generate_tuple_functions(const ::Type* type) {
			const Type tuple_type = get_type(type);
			const std::vector<const ::Type*>& element_types = static_cast<const TupleType*>(type)->get_element_types();
			const Type void_type = get_type(TypeInterner::get_void_type());
			IndentPrinter& printer = type_function_printer;

			// tuple_copy
			function_declaration_printer.println(format("static % %_copy(%);", tuple_type, tuple_type, tuple_type));
			printer.println_increasing(format("static % %_copy(% tuple) {", tuple_type, tuple_type, tuple_type));
			printer.println(format("% new_tuple;", tuple_type));
			for (std::size_t i = 0; i < element_types.size(); ++i) {
				if (is_managed(element_types[i])) {
					printer.println(format("new_tuple.v% = %_copy(tuple.v%);", print_number(i), get_type(element_types[i]), print_number(i)));
				}
				else if (element_types[i] != TypeInterner::get_void_type()) {
					printer.println(format("new_tuple.v% = tuple.v%;", print_number(i), print_number(i)));
				}
			}
			printer.println("return new_tuple;");
			printer.println_decreasing("}");

			// tuple_free
			function_declaration_printer.println(format("static % %_free(%);", void_type, tuple_type, tuple_type));
			printer.println_increasing(format("static % %_free(% tuple) {", void_type, tuple_type, tuple_type));
			for (std::size_t i = 0; i < element_types.size(); ++i) {
				if (is_managed(element_types[i])) {
					printer.println(format("%_free(tuple.v%);", get_type(element_types[i]), print_number(i)));
				}
			}
			printer.println_decreasing("}");
		}